

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ESoinn.cpp
# Opt level: O2

void __thiscall
nn::ESoinn::findClustersMCL
          (ESoinn *this,
          vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          *clusters)

{
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  ConcreteLogger *this_01;
  pointer pbVar1;
  istream *piVar2;
  unsigned_long uVar3;
  runtime_error *this_02;
  string *s;
  undefined1 __str [8];
  undefined1 local_318 [8];
  ifstream fi;
  byte abStack_2f8 [488];
  is_any_ofF<char> local_110;
  undefined1 local_f8 [8];
  string options;
  string command;
  vector<unsigned_int,_std::allocator<unsigned_int>_> one_cluster;
  string output_mcl;
  undefined1 auStack_78 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  items;
  undefined1 local_58 [8];
  string line;
  uint32_t neuron_num;
  
  this_01 = log_netw;
  std::__cxx11::string::string
            ((string *)local_318,"findClusterMCL function",
             (allocator *)
             &one_cluster.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  logger::ConcreteLogger::debug(this_01,(string *)local_318,false);
  std::__cxx11::string::~string((string *)local_318);
  exportEdgesFile(this,(string *)output_src_mcl_abi_cxx11_);
  std::__cxx11::string::string
            ((string *)
             &one_cluster.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,"mcl_clusters.tmp",(allocator *)local_318);
  std::__cxx11::string::string((string *)local_f8," -I 3.0 --abc -o ",(allocator *)local_318);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 mcl_path_abi_cxx11_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 output_src_mcl_abi_cxx11_);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_318,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&options.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_318,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &one_cluster.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)local_318);
  std::__cxx11::string::~string((string *)local_58);
  system((char *)options.field_2._8_8_);
  std::ifstream::ifstream
            (local_318,
             (string *)
             &one_cluster.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,_S_in);
  if ((abStack_2f8[*(long *)((long)local_318 + -0x18)] & 5) == 0) {
    local_58 = (undefined1  [8])&line._M_string_length;
    line._M_dataplus._M_p = (pointer)0x0;
    line._M_string_length._0_1_ = 0;
    this_00 = (_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)
              (&command.field_2._M_allocated_capacity + 1);
    while( true ) {
      piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_318,(string *)local_58);
      if ((((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) ||
         (line._M_dataplus._M_p == (pointer)0x0)) break;
      auStack_78 = (undefined1  [8])0x0;
      items.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      items.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      boost::algorithm::is_any_of<char[2]>(&local_110,(char (*) [2])0x14325e);
      boost::algorithm::
      split<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string&,boost::algorithm::detail::is_any_ofF<char>>
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)auStack_78,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                 &local_110,token_compress_off);
      boost::algorithm::detail::is_any_ofF<char>::~is_any_ofF(&local_110);
      pbVar1 = items.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      one_cluster.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      command.field_2._8_8_ = 0;
      one_cluster.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      for (__str = auStack_78; __str != (undefined1  [8])pbVar1;
          __str = (undefined1  [8])((long)__str + 0x20)) {
        uVar3 = std::__cxx11::stoul((string *)__str,(size_t *)0x0,10);
        line.field_2._12_4_ = (undefined4)uVar3;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00,
                   (value_type_conflict3 *)(line.field_2._M_local_buf + 0xc));
      }
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::push_back(clusters,(value_type *)this_00);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(this_00);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)auStack_78);
    }
    std::__cxx11::string::~string((string *)local_58);
    std::ifstream::~ifstream(local_318);
    std::__cxx11::string::~string((string *)(options.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_f8);
    std::__cxx11::string::~string
              ((string *)
               &one_cluster.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    return;
  }
  this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_78,
                 "Can\'t read mcl output file. File ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &one_cluster.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_78,
                 " is not found");
  std::runtime_error::runtime_error(this_02,(string *)local_58);
  __cxa_throw(this_02,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void ESoinn::findClustersMCL(std::vector<std::vector<uint32_t>>& clusters) const
    {
        log_netw->debug("findClusterMCL function");
        
        //prepare input data for mcl
        exportEdgesFile(output_src_mcl);
    
        //run mcl algorithm
        std::string output_mcl = "mcl_clusters.tmp";    
        std::string options = " -I 3.0 --abc -o ";
        std::string command = mcl_path + output_src_mcl + options + output_mcl;
        system(command.c_str());
        
        //read output mcl file and form results
        std::ifstream fi(output_mcl);
        if (not fi)
            throw std::runtime_error("Can't read mcl output file. File " + output_mcl + " is not found");
        
        std::string line;
        while (std::getline(fi, line) and !line.empty())
        {
            std::vector<std::string> items;
            boost::split(items, line, boost::is_any_of("\t"));
            std::vector<uint32_t> one_cluster;
            for (const std::string& s: items)
            {
                uint32_t neuron_num = std::stoul(s);
                one_cluster.push_back(neuron_num);
            }
            clusters.push_back(one_cluster);
        }

        //remove temporary files
        //std::remove(output_src_mcl.c_str());
        //std::remove(output_mcl.c_str());
    }